

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  VkDevice *ppVVar1;
  PlatformInterface *pPVar2;
  Deleter<vk::VkInstance_s_*> **ppDVar3;
  bool bVar4;
  int iVar5;
  VkAllocationCallbacks *pVVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  Resources res;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  EnvClone resEnv;
  Environment objEnv;
  VkPipelineLayout local_898;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_890;
  Move<vk::Handle<(vk::HandleType)16>_> local_878;
  Resources local_850;
  Environment local_820;
  AllocationCallbackRecorder local_7e8;
  AllocationCallbackRecorder local_788;
  EnvClone local_728;
  Environment local_68;
  
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_788,pVVar6,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar7 = Context::getDeviceInterface(context);
  pVVar8 = Context::getDevice(context);
  local_820.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_820.programBinaries = context->m_progCollection;
  local_820.allocationCallbacks =
       &local_788.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_820.maxResourceConsumers = 1;
  local_820.vkp = pPVar2;
  local_820.vkd = pDVar7;
  local_820.device = pVVar8;
  iVar5 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_7e8.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)((ulong)(iVar5 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_728,&local_820,(Parameters *)&local_7e8,iVar5 - 1U);
  PipelineLayout::Resources::Resources(&local_850,&local_728.env,params);
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7e8,pVVar6,0x80);
  local_68.allocationCallbacks =
       &local_7e8.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_68.vkp = local_728.env.vkp;
  local_68.vkd = local_728.env.vkd;
  local_68.device = local_728.env.device;
  local_68.queueFamilyIndex = local_728.env.queueFamilyIndex;
  local_68.programBinaries = local_728.env.programBinaries;
  local_68.maxResourceConsumers = local_728.env.maxResourceConsumers;
  PipelineLayout::create(&local_878,&local_68,&local_850,params);
  DStack_890.m_device =
       local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  DStack_890.m_allocator =
       local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_898.m_internal =
       local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  DStack_890.m_deviceIface =
       local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7e8,0x1e);
  if (bVar4) {
    if (local_898.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_890,local_898);
    }
LAB_003f57a3:
    bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7e8,0);
    if (bVar4) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
      if (local_850.pSetLayouts.
          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_850.pSetLayouts.
                        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_850.pSetLayouts.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_850.pSetLayouts.
                              super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
      ::~vector(&local_850.descriptorSetLayouts);
      ::vk::DeviceDriver::~DeviceDriver(&local_728.vkd);
      if (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_728.deviceRes.vki);
      if (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_788,0);
      ppDVar3 = (Deleter<vk::VkInstance_s_*> **)
                &local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_728.deviceRes.instance._0_8_ = ppDVar3;
      if (bVar4) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_728.deviceRes.instance._0_8_,
                   local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_728.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_728,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_728.deviceRes.instance._0_8_,
                   local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_728.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_728.deviceRes.instance._0_8_ != ppDVar3) {
        operator_delete((void *)local_728.deviceRes.instance._0_8_,
                        (ulong)(local_728.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_003f5a49;
    }
    local_898.m_internal = (deUint64)&DStack_890.m_device;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_898,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_898.m_internal,
               (undefined1 *)
               ((long)&(DStack_890.m_deviceIface)->_vptr_DeviceInterface + local_898.m_internal));
    if ((VkDevice *)local_898.m_internal != &DStack_890.m_device) {
      operator_delete((void *)local_898.m_internal,(ulong)(DStack_890.m_device + 1));
    }
  }
  else {
    ppVVar1 = &local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
    local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
         (deUint64)ppVVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_878,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal));
    if ((VkDevice *)
        local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != ppVVar1
       ) {
      operator_delete((void *)local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object
                              .m_internal,
                      (ulong)(local_878.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                              deleter.m_device + 1));
    }
    if (local_898.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_890,local_898);
    }
    if (bVar4) goto LAB_003f57a3;
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7e8);
  if (local_850.pSetLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_850.pSetLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_850.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_850.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ::~vector(&local_850.descriptorSetLayouts);
  ::vk::DeviceDriver::~DeviceDriver(&local_728.vkd);
  if (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_728.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_728.deviceRes.vki);
  if (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
       (VkInstance_s *)0x0;
  local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
  m_destroyInstance = (DestroyInstanceFunc)0x0;
  local_728.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
LAB_003f5a49:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_788);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}